

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall
pbrt::TriangleMesh::TriangleMesh
          (TriangleMesh *this,Transform *renderFromObject,bool reverseOrientation,
          vector<int,_std::allocator<int>_> *indices,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *p,
          vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *s,
          vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *n,
          vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *uv,
          vector<int,_std::allocator<int>_> *faceIndices)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  int iVar9;
  size_type sVar10;
  int *piVar11;
  reference pPVar12;
  Point3<float> *pPVar13;
  Point2<float> *pPVar14;
  reference pNVar15;
  Normal3<float> *pNVar16;
  reference pVVar17;
  Vector3<float> *pVVar18;
  size_type sVar19;
  vector<int,_std::allocator<int>_> *in_RCX;
  byte in_DL;
  char (*in_RDI) [21];
  Transform *in_R8;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *in_R9;
  long *in_FS_OFFSET;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  Point3<float> PVar20;
  Normal3<float> NVar21;
  Vector3<float> VVar22;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *in_stack_00000008;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *in_stack_00000010;
  vector<int,_std::allocator<int>_> *in_stack_00000018;
  int vb_6;
  size_type va_6;
  int vb_5;
  size_type va_5;
  size_type vb_4;
  int va_4;
  Vector3f *ss;
  iterator __end2_1;
  iterator __begin2_1;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *__range2_1;
  size_type vb_3;
  int va_3;
  Normal3f *nn;
  iterator __end2;
  iterator __begin2;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *__range2;
  size_type vb_2;
  int va_2;
  size_type vb_1;
  int va_1;
  Point3f *pt;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *__range1;
  int vb;
  size_type va;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *in_stack_fffffffffffffe18;
  Tuple3<pbrt::Normal3,_float> *in_stack_fffffffffffffe20;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined8 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined8 in_stack_fffffffffffffe90;
  LogLevel LVar23;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  unsigned_long *in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  iterator in_stack_fffffffffffffed0;
  iterator in_stack_fffffffffffffed8;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  __normal_iterator<pbrt::Normal3<float>_*,_std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>_>
  local_b8 [2];
  size_type local_a8;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
  local_58 [2];
  undefined4 local_44;
  ulong local_40;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *p_00;
  Transform *this_00;
  
  p_00 = in_R9;
  this_00 = in_R8;
  sVar10 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar10;
  *(int *)*in_RDI = SUB164(auVar2 / ZEXT816(3),0);
  sVar10 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                     ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)in_R8);
  *(int *)(*in_RDI + 4) = (int)sVar10;
  *(char *)((long)in_RDI + 8) = '\0';
  *(char *)((long)in_RDI + 9) = '\0';
  *(char *)((long)in_RDI + 10) = '\0';
  *(char *)((long)in_RDI + 0xb) = '\0';
  *(char *)((long)in_RDI + 0xc) = '\0';
  *(char *)((long)in_RDI + 0xd) = '\0';
  *(char *)((long)in_RDI + 0xe) = '\0';
  *(char *)((long)in_RDI + 0xf) = '\0';
  *(undefined8 *)(*in_RDI + 0x10) = 0;
  *(char *)((long)(in_RDI + 1) + 3) = '\0';
  *(char *)((long)(in_RDI + 1) + 4) = '\0';
  *(char *)((long)(in_RDI + 1) + 5) = '\0';
  *(char *)((long)(in_RDI + 1) + 6) = '\0';
  *(char *)((long)(in_RDI + 1) + 7) = '\0';
  *(char *)((long)(in_RDI + 1) + 8) = '\0';
  *(char *)((long)(in_RDI + 1) + 9) = '\0';
  *(char *)((long)(in_RDI + 1) + 10) = '\0';
  *(char *)((long)(in_RDI + 1) + 0xb) = '\0';
  *(char *)((long)(in_RDI + 1) + 0xc) = '\0';
  *(char *)((long)(in_RDI + 1) + 0xd) = '\0';
  *(char *)((long)(in_RDI + 1) + 0xe) = '\0';
  *(char *)((long)(in_RDI + 1) + 0xf) = '\0';
  *(char *)((long)(in_RDI + 1) + 0x10) = '\0';
  *(char *)((long)(in_RDI + 1) + 0x11) = '\0';
  *(char *)((long)(in_RDI + 1) + 0x12) = '\0';
  *(undefined8 *)(in_RDI[1] + 0x13) = 0;
  *(char *)((long)(in_RDI + 2) + 6) = '\0';
  *(char *)((long)(in_RDI + 2) + 7) = '\0';
  *(char *)((long)(in_RDI + 2) + 8) = '\0';
  *(char *)((long)(in_RDI + 2) + 9) = '\0';
  *(char *)((long)(in_RDI + 2) + 10) = '\0';
  *(char *)((long)(in_RDI + 2) + 0xb) = '\0';
  *(char *)((long)(in_RDI + 2) + 0xc) = '\0';
  *(char *)((long)(in_RDI + 2) + 0xd) = '\0';
  sVar10 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  local_40 = sVar10 % 3;
  local_44 = 0;
  if (local_40 != 0) {
    LogFatal<char_const(&)[21],char_const(&)[2],char_const(&)[21],unsigned_long&,char_const(&)[2],int&>
              ((LogLevel)((ulong)in_stack_fffffffffffffe90 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),in_RDI,
               (char (*) [2])in_R8,
               (char (*) [21])CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffea8,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  *(long *)(*in_FS_OFFSET + -0x338) = *(long *)(*in_FS_OFFSET + -0x338) + 1;
  *(long *)(*in_FS_OFFSET + -0x330) = (long)*(int *)*in_RDI + *(long *)(*in_FS_OFFSET + -0x330);
  *(long *)(*in_FS_OFFSET + -0x328) = *(long *)(*in_FS_OFFSET + -0x328) + 0x40;
  piVar11 = BufferCache<int>::LookupOrAdd
                      ((BufferCache<int> *)in_stack_fffffffffffffed8._M_current,
                       (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0._M_current);
  *(int **)(*in_RDI + 8) = piVar11;
  local_58[0]._M_current =
       (Point3<float> *)
       std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::begin
                 ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                  in_stack_fffffffffffffe18);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::end
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             in_stack_fffffffffffffe18);
  while( true ) {
    bVar7 = __gnu_cxx::operator!=
                      ((__normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                        *)in_stack_fffffffffffffe20,
                       (__normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                        *)in_stack_fffffffffffffe18);
    if (!bVar7) break;
    pPVar12 = __gnu_cxx::
              __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
              ::operator*(local_58);
    PVar20 = Transform::operator()(this_00,(Point3<float> *)p_00);
    auVar6._8_8_ = extraout_XMM0_Qb;
    auVar6._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
    uVar1 = vmovlpd_avx(auVar6);
    (pPVar12->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar1;
    (pPVar12->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
    (pPVar12->super_Tuple3<pbrt::Point3,_float>).z = PVar20.super_Tuple3<pbrt::Point3,_float>.z;
    __gnu_cxx::
    __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
    ::operator++(local_58);
  }
  pPVar13 = BufferCache<pbrt::Point3<float>_>::LookupOrAdd
                      ((BufferCache<pbrt::Point3<float>_> *)in_stack_fffffffffffffed8._M_current,
                       (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                       in_stack_fffffffffffffed0._M_current);
  *(Point3<float> **)(*in_RDI + 0x10) = pPVar13;
  in_RDI[2][0xe] = in_DL & 1;
  bVar7 = Transform::SwapsHandedness
                    ((Transform *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  in_RDI[2][0xf] = bVar7;
  bVar7 = std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::empty
                    ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                     in_stack_fffffffffffffe30);
  if (!bVar7) {
    iVar9 = *(int *)(*in_RDI + 4);
    sVar10 = std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::size
                       (in_stack_00000010);
    if ((long)iVar9 != sVar10) {
      LogFatal<char_const(&)[10],char_const(&)[10],char_const(&)[10],int&,char_const(&)[10],unsigned_long&>
                ((LogLevel)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (char (*) [10])in_RDI,(char (*) [10])in_R8,
                 (char (*) [10])CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (int *)in_stack_fffffffffffffea8,
                 (char (*) [10])CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    pPVar14 = BufferCache<pbrt::Point2<float>_>::LookupOrAdd
                        ((BufferCache<pbrt::Point2<float>_> *)in_stack_fffffffffffffed8._M_current,
                         (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                         in_stack_fffffffffffffed0._M_current);
    *(Point2<float> **)(in_RDI[1] + 0x13) = pPVar14;
  }
  bVar7 = std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::empty
                    ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                     in_stack_fffffffffffffe30);
  if (!bVar7) {
    iVar9 = *(int *)(*in_RDI + 4);
    local_a8 = std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::size
                         (in_stack_00000008);
    if ((long)iVar9 != local_a8) {
      LogFatal<char_const(&)[10],char_const(&)[9],char_const(&)[10],int&,char_const(&)[9],unsigned_long&>
                ((LogLevel)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (char (*) [10])in_RDI,(char (*) [9])in_R8,
                 (char (*) [10])CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (int *)in_stack_fffffffffffffea8,
                 (char (*) [9])CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    local_b8[0]._M_current =
         (Normal3<float> *)
         std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::begin
                   (in_stack_fffffffffffffe18);
    std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::end
              (in_stack_fffffffffffffe18);
    while( true ) {
      bVar7 = __gnu_cxx::operator!=
                        ((__normal_iterator<pbrt::Normal3<float>_*,_std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>_>
                          *)in_stack_fffffffffffffe20,
                         (__normal_iterator<pbrt::Normal3<float>_*,_std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>_>
                          *)in_stack_fffffffffffffe18);
      if (!bVar7) break;
      pNVar15 = __gnu_cxx::
                __normal_iterator<pbrt::Normal3<float>_*,_std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>_>
                ::operator*(local_b8);
      NVar21 = Transform::operator()
                         ((Transform *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                          ,(Normal3<float> *)
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      in_stack_ffffffffffffff34 = NVar21.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar4._8_8_ = extraout_XMM0_Qb_00;
      auVar4._0_8_ = NVar21.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      uVar1 = vmovlpd_avx(auVar4);
      in_stack_ffffffffffffff2c = (undefined4)uVar1;
      in_stack_ffffffffffffff30 = (undefined4)((ulong)uVar1 >> 0x20);
      (pNVar15->super_Tuple3<pbrt::Normal3,_float>).x = (float)(int)uVar1;
      (pNVar15->super_Tuple3<pbrt::Normal3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
      (pNVar15->super_Tuple3<pbrt::Normal3,_float>).z = in_stack_ffffffffffffff34;
      if ((in_DL & 1) != 0) {
        NVar21 = Tuple3<pbrt::Normal3,_float>::operator-(in_stack_fffffffffffffe20);
        auVar5._8_8_ = extraout_XMM0_Qb_01;
        auVar5._0_8_ = NVar21.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        uVar1 = vmovlpd_avx(auVar5);
        (pNVar15->super_Tuple3<pbrt::Normal3,_float>).x = (float)(int)uVar1;
        (pNVar15->super_Tuple3<pbrt::Normal3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
        (pNVar15->super_Tuple3<pbrt::Normal3,_float>).z =
             NVar21.super_Tuple3<pbrt::Normal3,_float>.z;
      }
      __gnu_cxx::
      __normal_iterator<pbrt::Normal3<float>_*,_std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>_>
      ::operator++(local_b8);
    }
    pNVar16 = BufferCache<pbrt::Normal3<float>_>::LookupOrAdd
                        ((BufferCache<pbrt::Normal3<float>_> *)in_stack_fffffffffffffed8._M_current,
                         (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                         in_stack_fffffffffffffed0._M_current);
    *(Normal3<float> **)(in_RDI[1] + 3) = pNVar16;
  }
  bVar7 = std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::empty
                    ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
                     in_stack_fffffffffffffe30);
  iVar9 = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  LVar23 = (LogLevel)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  if (!bVar7) {
    iVar9 = *(int *)(*in_RDI + 4);
    sVar10 = std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::size(in_R9);
    if ((long)iVar9 != sVar10) {
      LogFatal<char_const(&)[10],char_const(&)[9],char_const(&)[10],int&,char_const(&)[9],unsigned_long&>
                ((LogLevel)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (char (*) [10])in_RDI,(char (*) [9])in_R8,
                 (char (*) [10])CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (int *)in_stack_fffffffffffffea8,
                 (char (*) [9])CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    in_stack_fffffffffffffed8 =
         std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::begin
                   ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
                    in_stack_fffffffffffffe18);
    in_stack_fffffffffffffed0 =
         std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::end
                   ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
                    in_stack_fffffffffffffe18);
    while( true ) {
      bVar7 = __gnu_cxx::operator!=
                        ((__normal_iterator<pbrt::Vector3<float>_*,_std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>_>
                          *)in_stack_fffffffffffffe20,
                         (__normal_iterator<pbrt::Vector3<float>_*,_std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>_>
                          *)in_stack_fffffffffffffe18);
      iVar9 = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
      LVar23 = (LogLevel)((ulong)in_stack_fffffffffffffe90 >> 0x20);
      if (!bVar7) break;
      pVVar17 = __gnu_cxx::
                __normal_iterator<pbrt::Vector3<float>_*,_std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>_>
                ::operator*((__normal_iterator<pbrt::Vector3<float>_*,_std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>_>
                             *)&stack0xfffffffffffffed8);
      VVar22 = Transform::operator()
                         ((Transform *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                          ,(Vector3<float> *)
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      in_stack_fffffffffffffeb0 = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar3._8_8_ = extraout_XMM0_Qb_02;
      auVar3._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      in_stack_fffffffffffffea8 = (unsigned_long *)vmovlpd_avx(auVar3);
      in_stack_fffffffffffffebc = SUB84(in_stack_fffffffffffffea8,0);
      *(unsigned_long **)&pVVar17->super_Tuple3<pbrt::Vector3,_float> = in_stack_fffffffffffffea8;
      (pVVar17->super_Tuple3<pbrt::Vector3,_float>).z = in_stack_fffffffffffffeb0;
      __gnu_cxx::
      __normal_iterator<pbrt::Vector3<float>_*,_std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>_>
      ::operator++((__normal_iterator<pbrt::Vector3<float>_*,_std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>_>
                    *)&stack0xfffffffffffffed8);
    }
    pVVar18 = BufferCache<pbrt::Vector3<float>_>::LookupOrAdd
                        ((BufferCache<pbrt::Vector3<float>_> *)in_stack_fffffffffffffed8._M_current,
                         (vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
                         in_stack_fffffffffffffed0._M_current);
    *(Vector3<float> **)(in_RDI[1] + 0xb) = pVVar18;
  }
  bVar7 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffe30);
  if (!bVar7) {
    in_stack_fffffffffffffea4 = *(int *)*in_RDI;
    sVar10 = std::vector<int,_std::allocator<int>_>::size(in_stack_00000018);
    if ((long)in_stack_fffffffffffffea4 != sVar10) {
      LogFatal<char_const(&)[11],char_const(&)[19],char_const(&)[11],int&,char_const(&)[19],unsigned_long&>
                (LVar23,(char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),iVar9,
                 (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (char (*) [11])in_RDI,(char (*) [19])in_R8,
                 (char (*) [11])CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (int *)in_stack_fffffffffffffea8,
                 (char (*) [19])CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    piVar11 = BufferCache<int>::LookupOrAdd
                        ((BufferCache<int> *)in_stack_fffffffffffffed8._M_current,
                         (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0._M_current);
    *(int **)(in_RDI[2] + 6) = piVar11;
  }
  sVar10 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                     ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)in_R8);
  iVar8 = std::numeric_limits<int>::max();
  if ((ulong)(long)iVar8 < sVar10) {
    LogFatal<char_const(&)[9],char_const(&)[32],char_const(&)[9],unsigned_long&,char_const(&)[32],int&>
              ((LogLevel)(sVar10 >> 0x20),(char *)CONCAT44(iVar8,in_stack_fffffffffffffe88),iVar9,
               (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               (char (*) [9])in_RDI,(char (*) [32])in_R8,
               (char (*) [9])CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffea8,
               (char (*) [32])CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  sVar19 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  LVar23 = (LogLevel)(sVar10 >> 0x20);
  iVar9 = std::numeric_limits<int>::max();
  if ((ulong)(long)iVar9 < sVar19) {
    LogFatal<char_const(&)[15],char_const(&)[32],char_const(&)[15],unsigned_long&,char_const(&)[32],int&>
              (LVar23,(char *)CONCAT44(iVar8,in_stack_fffffffffffffe88),(int)(sVar19 >> 0x20),
               (char *)CONCAT44(iVar9,in_stack_fffffffffffffe78),(char (*) [15])in_RDI,
               (char (*) [32])in_R8,
               (char (*) [15])CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffea8,
               (char (*) [32])CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  return;
}

Assistant:

TriangleMesh::TriangleMesh(const Transform &renderFromObject, bool reverseOrientation,
                           std::vector<int> indices, std::vector<Point3f> p,
                           std::vector<Vector3f> s, std::vector<Normal3f> n,
                           std::vector<Point2f> uv, std::vector<int> faceIndices)
    : nTriangles(indices.size() / 3), nVertices(p.size()) {
    CHECK_EQ((indices.size() % 3), 0);
    ++nTriMeshes;
    nTris += nTriangles;
    triangleBytes += sizeof(*this);
    // Initialize mesh _vertexIndices_
    vertexIndices = intBufferCache->LookupOrAdd(indices);

    // Transform mesh vertices to render space and initialize mesh _p_
    for (Point3f &pt : p)
        pt = renderFromObject(pt);
    this->p = point3BufferCache->LookupOrAdd(p);

    // Remainder of _TriangleMesh_ constructor
    this->reverseOrientation = reverseOrientation;
    this->transformSwapsHandedness = renderFromObject.SwapsHandedness();

    if (!uv.empty()) {
        CHECK_EQ(nVertices, uv.size());
        this->uv = point2BufferCache->LookupOrAdd(uv);
    }
    if (!n.empty()) {
        CHECK_EQ(nVertices, n.size());
        for (Normal3f &nn : n) {
            nn = renderFromObject(nn);
            if (reverseOrientation)
                nn = -nn;
        }
        this->n = normal3BufferCache->LookupOrAdd(n);
    }
    if (!s.empty()) {
        CHECK_EQ(nVertices, s.size());
        for (Vector3f &ss : s)
            ss = renderFromObject(ss);
        this->s = vector3BufferCache->LookupOrAdd(s);
    }

    if (!faceIndices.empty()) {
        CHECK_EQ(nTriangles, faceIndices.size());
        this->faceIndices = intBufferCache->LookupOrAdd(faceIndices);
    }

    // Make sure that we don't have too much stuff to be using integers to
    // index into things.
    CHECK_LE(p.size(), std::numeric_limits<int>::max());
    // We could be clever and check indices.size() / 3 if we were careful
    // to promote to a 64-bit int before multiplying by 3 when we look up
    // in the indices array...
    CHECK_LE(indices.size(), std::numeric_limits<int>::max());
}